

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O0

boolean decode_mcu_DC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RSI;
  long *in_RDI;
  int m;
  int v;
  int sign;
  int tbl;
  int ci;
  int blkn;
  uchar *st;
  JBLOCKROW block;
  arith_entropy_ptr_conflict entropy;
  uint local_48;
  uint local_44;
  int local_34;
  j_decompress_ptr in_stack_ffffffffffffffd0;
  uchar *st_00;
  j_decompress_ptr cinfo_00;
  
  cinfo_00 = (j_decompress_ptr)in_RDI[0x4a];
  if ((int)in_RDI[0x2e] != 0) {
    if (*(int *)&cinfo_00->field_0x4c == 0) {
      process_restart(in_stack_ffffffffffffffd0);
    }
    *(int *)&cinfo_00->field_0x4c = *(int *)&cinfo_00->field_0x4c + -1;
  }
  if (*(int *)&cinfo_00->src != -1) {
    for (local_34 = 0; local_34 < (int)in_RDI[0x3c]; local_34 = local_34 + 1) {
      st_00 = *(uchar **)(in_RSI + (long)local_34 * 8);
      iVar1 = *(int *)((long)in_RDI + (long)local_34 * 4 + 0x1e4);
      iVar4 = *(int *)(in_RDI[(long)iVar1 + 0x37] + 0x14);
      iVar2 = arith_decode(cinfo_00,st_00);
      if (iVar2 == 0) {
        (&cinfo_00->jpeg_color_space)[iVar1] = JCS_UNKNOWN;
      }
      else {
        iVar2 = arith_decode(cinfo_00,st_00);
        local_48 = arith_decode(cinfo_00,st_00);
        if (local_48 != 0) {
          while (iVar3 = arith_decode(cinfo_00,st_00), iVar3 != 0) {
            local_48 = local_48 << 1;
            if (local_48 == 0x8000) {
              *(undefined4 *)(*in_RDI + 0x28) = 0x7e;
              (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
              *(undefined4 *)&cinfo_00->src = 0xffffffff;
              return 1;
            }
          }
        }
        if ((int)local_48 <
            (int)((1L << (*(byte *)((long)in_RDI + (long)iVar4 + 0x140) & 0x3f)) >> 1)) {
          (&cinfo_00->jpeg_color_space)[iVar1] = JCS_UNKNOWN;
        }
        else if ((int)((1L << (*(byte *)((long)in_RDI + (long)iVar4 + 0x150) & 0x3f)) >> 1) <
                 (int)local_48) {
          (&cinfo_00->jpeg_color_space)[iVar1] = iVar2 * 4 + JCS_EXT_RGBA;
        }
        else {
          (&cinfo_00->jpeg_color_space)[iVar1] = iVar2 * 4 + JCS_CMYK;
        }
        local_44 = local_48;
        while (local_48 = (int)local_48 >> 1, local_48 != 0) {
          iVar4 = arith_decode(cinfo_00,st_00);
          if (iVar4 != 0) {
            local_44 = local_48 | local_44;
          }
        }
        local_44 = local_44 + 1;
        if (iVar2 != 0) {
          local_44 = -local_44;
        }
        *(uint *)((long)&cinfo_00->src + (long)iVar1 * 4 + 4) =
             *(int *)((long)&cinfo_00->src + (long)iVar1 * 4 + 4) + local_44 & 0xffff;
      }
      *(short *)st_00 =
           (short)((long)*(int *)((long)&cinfo_00->src + (long)iVar1 * 4 + 4) <<
                  ((byte)(int)in_RDI[0x43] & 0x3f));
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_first(j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  int Al = cinfo->Al;
  register int s, r;
  int blkn, ci;
  JBLOCKROW block;
  BITREAD_STATE_VARS;
  savable_state state;
  d_derived_tbl *tbl;
  jpeg_component_info *compptr;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!process_restart(cinfo))
        return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (!entropy->pub.insufficient_data) {

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo, entropy->bitstate);
    state = entropy->saved;

    /* Outer loop handles each block in the MCU */

    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      block = MCU_data[blkn];
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      tbl = entropy->derived_tbls[compptr->dc_tbl_no];

      /* Decode a single block's worth of coefficients */

      /* Section F.2.2.1: decode the DC coefficient difference */
      HUFF_DECODE(s, br_state, tbl, return FALSE, label1);
      if (s) {
        CHECK_BIT_BUFFER(br_state, s, return FALSE);
        r = GET_BITS(s);
        s = HUFF_EXTEND(r, s);
      }

      /* Convert DC difference to actual value, update last_dc_val */
      if ((state.last_dc_val[ci] >= 0 &&
           s > INT_MAX - state.last_dc_val[ci]) ||
          (state.last_dc_val[ci] < 0 && s < INT_MIN - state.last_dc_val[ci]))
        ERREXIT(cinfo, JERR_BAD_DCT_COEF);
      s += state.last_dc_val[ci];
      state.last_dc_val[ci] = s;
      /* Scale and output the coefficient (assumes jpeg_natural_order[0]=0) */
      (*block)[0] = (JCOEF)LEFT_SHIFT(s, Al);
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo, entropy->bitstate);
    entropy->saved = state;
  }

  /* Account for restart interval (no-op if not using restarts) */
  if (cinfo->restart_interval)
    entropy->restarts_to_go--;

  return TRUE;
}